

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# camera.h
# Opt level: O0

void __thiscall
PerspectiveCamera::dump
          (PerspectiveCamera *this,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<ParamType,_void_*>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<ParamType,_void_*>_>_>_>
          *t)

{
  mapped_type *pmVar1;
  mapped_type *pmVar2;
  pair<ParamType,_void_*> pVar3;
  int *in_stack_fffffffffffffd60;
  Vector3f *in_stack_fffffffffffffd70;
  key_type *in_stack_fffffffffffffd98;
  key_type *__k;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<ParamType,_void_*>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<ParamType,_void_*>_>_>_>
  *in_stack_fffffffffffffda0;
  allocator local_1d9;
  string local_1d8 [32];
  pair<ParamType,_void_*> local_1b8;
  allocator local_1a1;
  string local_1a0 [32];
  pair<ParamType,_void_*> local_180;
  undefined1 local_169 [33];
  pair<ParamType,_void_*> local_148;
  allocator local_131;
  string local_130 [32];
  pair<ParamType,_void_*> local_110;
  allocator local_f9;
  string local_f8 [32];
  pair<ParamType,_void_*> local_d8;
  allocator local_c1;
  string local_c0 [32];
  pair<ParamType,_void_*> local_a0;
  allocator local_89;
  string local_88 [32];
  pair<ParamType,_void_*> local_68 [2];
  allocator local_41;
  string local_40 [32];
  pair<ParamType,_void_*> local_20 [2];
  
  pVar3 = dump_element((int)((ulong)in_stack_fffffffffffffd60 >> 0x20));
  local_20[0].second = pVar3.second;
  local_20[0].first = pVar3.first;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_40,"camera_type",&local_41);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<ParamType,_void_*>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<ParamType,_void_*>_>_>_>
           ::operator[](in_stack_fffffffffffffda0,in_stack_fffffffffffffd98);
  std::pair<ParamType,_void_*>::operator=(pmVar1,local_20);
  std::__cxx11::string::~string(local_40);
  std::allocator<char>::~allocator((allocator<char> *)&local_41);
  pVar3 = dump_element(in_stack_fffffffffffffd70);
  local_68[0].second = pVar3.second;
  local_68[0].first = pVar3.first;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_88,"camera_center",&local_89);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<ParamType,_void_*>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<ParamType,_void_*>_>_>_>
           ::operator[](in_stack_fffffffffffffda0,in_stack_fffffffffffffd98);
  std::pair<ParamType,_void_*>::operator=(pmVar1,local_68);
  std::__cxx11::string::~string(local_88);
  std::allocator<char>::~allocator((allocator<char> *)&local_89);
  pVar3 = dump_element(in_stack_fffffffffffffd70);
  local_a0.second = pVar3.second;
  local_a0.first = pVar3.first;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_c0,"camera_direction",&local_c1);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<ParamType,_void_*>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<ParamType,_void_*>_>_>_>
           ::operator[](in_stack_fffffffffffffda0,in_stack_fffffffffffffd98);
  std::pair<ParamType,_void_*>::operator=(pmVar1,&local_a0);
  std::__cxx11::string::~string(local_c0);
  std::allocator<char>::~allocator((allocator<char> *)&local_c1);
  pVar3 = dump_element(in_stack_fffffffffffffd70);
  local_d8.second = pVar3.second;
  local_d8.first = pVar3.first;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_f8,"camera_up",&local_f9);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<ParamType,_void_*>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<ParamType,_void_*>_>_>_>
           ::operator[](in_stack_fffffffffffffda0,in_stack_fffffffffffffd98);
  std::pair<ParamType,_void_*>::operator=(pmVar1,&local_d8);
  std::__cxx11::string::~string(local_f8);
  std::allocator<char>::~allocator((allocator<char> *)&local_f9);
  pVar3 = dump_element(in_stack_fffffffffffffd70);
  local_110.second = pVar3.second;
  local_110.first = pVar3.first;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_130,"camera_horizontal",&local_131);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<ParamType,_void_*>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<ParamType,_void_*>_>_>_>
           ::operator[](in_stack_fffffffffffffda0,in_stack_fffffffffffffd98);
  std::pair<ParamType,_void_*>::operator=(pmVar1,&local_110);
  std::__cxx11::string::~string(local_130);
  std::allocator<char>::~allocator((allocator<char> *)&local_131);
  pVar3 = dump_element(in_stack_fffffffffffffd70->m_elements);
  local_148.second = pVar3.second;
  local_148.first = pVar3.first;
  __k = (key_type *)local_169;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)(local_169 + 1),"camera_dist",(allocator *)__k);
  pmVar2 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<ParamType,_void_*>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<ParamType,_void_*>_>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<ParamType,_void_*>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<ParamType,_void_*>_>_>_>
                         *)pmVar1,__k);
  std::pair<ParamType,_void_*>::operator=(pmVar2,&local_148);
  std::__cxx11::string::~string((string *)(local_169 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_169);
  pVar3 = dump_element(in_stack_fffffffffffffd60);
  local_180.second = pVar3.second;
  local_180.first = pVar3.first;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1a0,"camera_width",&local_1a1);
  pmVar2 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<ParamType,_void_*>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<ParamType,_void_*>_>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<ParamType,_void_*>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<ParamType,_void_*>_>_>_>
                         *)pmVar1,__k);
  std::pair<ParamType,_void_*>::operator=(pmVar2,&local_180);
  std::__cxx11::string::~string(local_1a0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1a1);
  pVar3 = dump_element(in_stack_fffffffffffffd60);
  local_1b8.second = pVar3.second;
  local_1b8.first = pVar3.first;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1d8,"camera_height",&local_1d9);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<ParamType,_void_*>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<ParamType,_void_*>_>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<ParamType,_void_*>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<ParamType,_void_*>_>_>_>
                         *)pmVar1,__k);
  std::pair<ParamType,_void_*>::operator=(pmVar1,&local_1b8);
  std::__cxx11::string::~string(local_1d8);
  std::allocator<char>::~allocator((allocator<char> *)&local_1d9);
  return;
}

Assistant:

void dump(std::map<std::string, std::pair<ParamType, void*>>& t) override{
#define DUMP(p,q) t[p]=dump_element(q)
		DUMP("camera_type", (int)PERSPECTIVECAM);
		DUMP("camera_center", &center);
		DUMP("camera_direction", &direction);
		DUMP("camera_up", &up);
		DUMP("camera_horizontal", &horizontal);
		DUMP("camera_dist", &dist);
		DUMP("camera_width", &width);
		DUMP("camera_height", &height);
#undef DUMP
	}